

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_dtoa(JSContext *ctx,double d,int radix,int n_digits,int flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  int iVar7;
  uint n_digits_00;
  uint uVar8;
  byte *pbVar9;
  byte *__src;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  double dVar18;
  JSValue JVar19;
  int in_stack_fffffffffffffe08;
  int decpt1;
  JSContext *local_1f0;
  double local_1e8;
  uint local_1d4;
  int sign1;
  int decpt2;
  ulong local_1c8;
  undefined4 local_1bc;
  char buf2 [128];
  char buf [128];
  int sign;
  
  uVar10 = (ulong)(uint)n_digits;
  uVar15 = CONCAT44(0,radix);
  if (0x7fefffffffffffff < (ulong)ABS(d)) {
    if (NAN(d)) {
      builtin_strncpy(buf,"NaN",4);
    }
    else {
      if (0.0 <= d) {
        pcVar13 = buf;
      }
      else {
        pcVar13 = buf + 1;
        buf[0] = '-';
      }
      builtin_strncpy(pcVar13,"Infinity",9);
    }
    goto LAB_0011e16d;
  }
  if (flags == 0) {
    uVar10 = (ulong)d;
    if (0xffc0000000000000 < uVar10 + 0xffe0000000000000 && (double)(long)uVar10 == d) {
      uVar4 = -uVar10;
      if (0 < (long)uVar10) {
        uVar4 = uVar10;
      }
      buf2[0x45] = '\0';
      pbVar9 = (byte *)(buf2 + 0x44);
      do {
        __src = pbVar9;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar15;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        bVar11 = SUB161(auVar2 % auVar1,0);
        bVar12 = bVar11 + 0x57;
        if (SUB168(auVar2 % auVar1,0) < 10) {
          bVar12 = bVar11 | 0x30;
        }
        *__src = bVar12;
        pbVar9 = __src + -1;
        bVar17 = uVar15 <= uVar4;
        uVar4 = uVar4 / uVar15;
      } while (bVar17);
      if ((long)uVar10 < 0) {
        *pbVar9 = 0x2d;
        __src = pbVar9;
      }
      strcpy(buf,(char *)__src);
      goto LAB_0011e16d;
    }
LAB_0011dea8:
    uVar8 = 1;
    local_1c8 = 0x15;
    uVar10 = 0x11;
    local_1f0 = ctx;
    local_1e8 = d;
    local_1d4 = flags;
    while (uVar8 < (uint)uVar10) {
      uVar14 = (uint)uVar10 + uVar8;
      n_digits_00 = uVar14 >> 1;
      js_ecvt1(local_1e8,n_digits_00,&decpt1,&sign,buf2,0,buf,in_stack_fffffffffffffe08);
      dVar18 = strtod(buf,(char **)0x0);
      if ((dVar18 != local_1e8) || (NAN(dVar18) || NAN(local_1e8))) {
        uVar8 = n_digits_00 + 1;
      }
      else {
        while ((uVar10 = (ulong)(1 < uVar14), 1 < (int)n_digits_00 &&
               (uVar10 = (ulong)n_digits_00, buf2[(ulong)n_digits_00 - 1] == '0'))) {
          n_digits_00 = n_digits_00 - 1;
        }
      }
    }
    iVar5 = 0;
  }
  else {
    d = (double)(~-(ulong)(d == 0.0) & (ulong)d);
    local_1e8 = d;
    if (flags == 2) {
      iVar7 = n_digits + 1;
      iVar6 = iVar7;
      iVar3 = snprintf(buf,0x80,"%.*f",d);
      iVar5 = 0;
      if (buf[(long)iVar3 + -1] == '5') {
        iVar3 = js_fcvt1(buf,iVar7,local_1e8,0x400,iVar6);
        iVar7 = js_fcvt1(buf2,iVar7,local_1e8,0x800,iVar6);
        iVar5 = 0;
        if ((iVar3 == iVar7) && (iVar3 = bcmp(buf,buf2,(long)iVar3), iVar3 == 0)) {
          iVar5 = (uint)(buf[0] != '-') * 0x400 + 0x400;
        }
      }
      js_fcvt1(buf,n_digits,local_1e8,iVar5,iVar6);
      goto LAB_0011e16d;
    }
    if ((flags & 3U) != 1) goto LAB_0011dea8;
    iVar6 = n_digits + 1;
    iVar5 = 0;
    local_1f0 = ctx;
    local_1d4 = flags;
    js_ecvt1(d,iVar6,&decpt1,&sign1,buf2,0,buf,in_stack_fffffffffffffe08);
    local_1c8 = uVar10;
    if (buf2[n_digits] == '5') {
      js_ecvt1(local_1e8,iVar6,&decpt1,&sign1,buf2,0x400,buf,in_stack_fffffffffffffe08);
      js_ecvt1(local_1e8,iVar6,&decpt2,&local_1bc,(char *)&sign,0x800,buf,in_stack_fffffffffffffe08)
      ;
      iVar6 = bcmp(buf2,&sign,(long)iVar6);
      if ((iVar6 == 0) && (iVar5 = 0, decpt1 == decpt2)) {
        iVar5 = (uint)(sign1 == 0) * 0x400 + 0x400;
      }
    }
  }
  pcVar13 = buf;
  iVar6 = (int)uVar10;
  js_ecvt1(local_1e8,iVar6,&decpt1,&sign,buf2,iVar5,pcVar13,in_stack_fffffffffffffe08);
  ctx = local_1f0;
  uVar15 = (ulong)(uint)decpt1;
  if (sign != 0) {
    pcVar13 = buf + 1;
    buf[0] = '-';
  }
  if ((local_1d4 & 4) == 0) {
    if (decpt1 <= (int)local_1c8 && 0 < decpt1) {
      if (decpt1 < iVar6) {
        memcpy(pcVar13,buf2,uVar15);
        pcVar13[uVar15] = '.';
        uVar4 = 0;
        uVar10 = (ulong)(uint)(iVar6 - decpt1);
        if (iVar6 - decpt1 < 1) {
          uVar10 = uVar4;
        }
        for (; uVar10 != uVar4; uVar4 = uVar4 + 1) {
          (pcVar13 + uVar15)[uVar4 + 1] = buf2[uVar4 + uVar15];
        }
        pcVar13[uVar4 + 1 + uVar15] = '\0';
        ctx = local_1f0;
      }
      else {
        __n = (size_t)iVar6;
        memcpy(pcVar13,buf2,__n);
        lVar16 = 0;
        iVar5 = decpt1 - iVar6;
        if (decpt1 - iVar6 < 1) {
          iVar5 = 0;
        }
        for (; iVar5 != (int)lVar16; lVar16 = lVar16 + 1) {
          pcVar13[lVar16 + __n] = '0';
        }
        pcVar13[lVar16 + __n] = '\0';
        ctx = local_1f0;
      }
      goto LAB_0011e16d;
    }
    if (decpt1 + 5U < 6) {
      pcVar13[0] = '0';
      pcVar13[1] = '.';
      for (lVar16 = 0; -decpt1 != (int)lVar16; lVar16 = lVar16 + 1) {
        pcVar13[lVar16 + 2] = '0';
      }
      memcpy(pcVar13 + lVar16 + 2,buf2,(long)iVar6);
      pcVar13[lVar16 + 2 + (long)iVar6] = '\0';
      ctx = local_1f0;
      goto LAB_0011e16d;
    }
  }
  *pcVar13 = buf2[0];
  if (iVar6 < 2) {
    pcVar13 = pcVar13 + 1;
  }
  else {
    pcVar13[1] = '.';
    for (lVar16 = 0; uVar10 - 1 != lVar16; lVar16 = lVar16 + 1) {
      pcVar13[lVar16 + 2] = buf2[lVar16 + 1];
    }
    pcVar13 = pcVar13 + lVar16 + 2;
  }
  *pcVar13 = 'e';
  if (decpt1 < 1) {
    pcVar13 = pcVar13 + 1;
  }
  else {
    pcVar13[1] = '+';
    pcVar13 = pcVar13 + 2;
  }
  sprintf(pcVar13,"%d",(ulong)(decpt1 - 1));
LAB_0011e16d:
  JVar19 = JS_NewString(ctx,buf);
  return JVar19;
}

Assistant:

static JSValue js_dtoa(JSContext *ctx,
                       double d, int radix, int n_digits, int flags)
{
    char buf[JS_DTOA_BUF_SIZE];
    js_dtoa1(buf, d, radix, n_digits, flags);
    return JS_NewString(ctx, buf);
}